

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void ImPlot::PlotShadedEx<ImPlot::GetterXsYs<signed_char>,ImPlot::GetterXsYs<signed_char>>
               (char *label_id,GetterXsYs<signed_char> *getter1,GetterXsYs<signed_char> *getter2)

{
  bool bVar1;
  int iVar2;
  ImPlotScale IVar3;
  TransformerLogLog local_13c;
  ShadedRenderer<ImPlot::GetterXsYs<signed_char>,_ImPlot::GetterXsYs<signed_char>,_ImPlot::TransformerLogLog>
  local_138;
  TransformerLinLog local_104;
  ShadedRenderer<ImPlot::GetterXsYs<signed_char>,_ImPlot::GetterXsYs<signed_char>,_ImPlot::TransformerLinLog>
  local_100;
  TransformerLogLin local_cc;
  ShadedRenderer<ImPlot::GetterXsYs<signed_char>,_ImPlot::GetterXsYs<signed_char>,_ImPlot::TransformerLogLin>
  local_c8;
  TransformerLinLin local_94;
  ShadedRenderer<ImPlot::GetterXsYs<signed_char>,_ImPlot::GetterXsYs<signed_char>,_ImPlot::TransformerLinLin>
  local_90;
  ImU32 local_5c;
  ImDrawList *pIStack_58;
  ImU32 col;
  ImDrawList *DrawList;
  ImPlotNextItemData *s;
  ImPlotPoint p2;
  ImPlotPoint p1;
  int i;
  GetterXsYs<signed_char> *getter2_local;
  GetterXsYs<signed_char> *getter1_local;
  char *label_id_local;
  
  bVar1 = BeginItem(label_id,1);
  if (bVar1) {
    bVar1 = FitThisFrame();
    if (bVar1) {
      for (p1.y._4_4_ = 0; iVar2 = ImMin<int>(getter1->Count,getter2->Count), p1.y._4_4_ < iVar2;
          p1.y._4_4_ = p1.y._4_4_ + 1) {
        join_0x00001240_0x00001200_ = GetterXsYs<signed_char>::operator()(getter1,p1.y._4_4_);
        _s = GetterXsYs<signed_char>::operator()(getter2,p1.y._4_4_);
        FitPoint((ImPlotPoint *)&p2.y);
        FitPoint((ImPlotPoint *)&s);
      }
    }
    DrawList = (ImDrawList *)GetItemData();
    pIStack_58 = GetPlotDrawList();
    if (((ulong)(DrawList->_TextureIdStack).Data & 0x10000000000) != 0) {
      local_5c = ImGui::GetColorU32((ImVec4 *)&DrawList->IdxBuffer);
      IVar3 = GetCurrentScale();
      switch(IVar3) {
      case 0:
        TransformerLinLin::TransformerLinLin(&local_94);
        ShadedRenderer<ImPlot::GetterXsYs<signed_char>,_ImPlot::GetterXsYs<signed_char>,_ImPlot::TransformerLinLin>
        ::ShadedRenderer(&local_90,getter1,getter2,&local_94,local_5c);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterXsYs<signed_char>,ImPlot::GetterXsYs<signed_char>,ImPlot::TransformerLinLin>>
                  (&local_90,pIStack_58,&GImPlot->CurrentPlot->PlotRect);
        break;
      case 1:
        TransformerLogLin::TransformerLogLin(&local_cc);
        ShadedRenderer<ImPlot::GetterXsYs<signed_char>,_ImPlot::GetterXsYs<signed_char>,_ImPlot::TransformerLogLin>
        ::ShadedRenderer(&local_c8,getter1,getter2,&local_cc,local_5c);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterXsYs<signed_char>,ImPlot::GetterXsYs<signed_char>,ImPlot::TransformerLogLin>>
                  (&local_c8,pIStack_58,&GImPlot->CurrentPlot->PlotRect);
        break;
      case 2:
        TransformerLinLog::TransformerLinLog(&local_104);
        ShadedRenderer<ImPlot::GetterXsYs<signed_char>,_ImPlot::GetterXsYs<signed_char>,_ImPlot::TransformerLinLog>
        ::ShadedRenderer(&local_100,getter1,getter2,&local_104,local_5c);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterXsYs<signed_char>,ImPlot::GetterXsYs<signed_char>,ImPlot::TransformerLinLog>>
                  (&local_100,pIStack_58,&GImPlot->CurrentPlot->PlotRect);
        break;
      case 3:
        TransformerLogLog::TransformerLogLog(&local_13c);
        ShadedRenderer<ImPlot::GetterXsYs<signed_char>,_ImPlot::GetterXsYs<signed_char>,_ImPlot::TransformerLogLog>
        ::ShadedRenderer(&local_138,getter1,getter2,&local_13c,local_5c);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterXsYs<signed_char>,ImPlot::GetterXsYs<signed_char>,ImPlot::TransformerLogLog>>
                  (&local_138,pIStack_58,&GImPlot->CurrentPlot->PlotRect);
      }
    }
    EndItem();
  }
  return;
}

Assistant:

inline void PlotShadedEx(const char* label_id, const Getter1& getter1, const Getter2& getter2) {
    if (BeginItem(label_id, ImPlotCol_Fill)) {
        if (FitThisFrame()) {
            for (int i = 0; i < ImMin(getter1.Count, getter2.Count); ++i) {
                ImPlotPoint p1 = getter1(i);
                ImPlotPoint p2 = getter2(i);
                FitPoint(p1);
                FitPoint(p2);
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList & DrawList = *GetPlotDrawList();
        if (s.RenderFill) {
            ImU32 col = ImGui::GetColorU32(s.Colors[ImPlotCol_Fill]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLinLin>(getter1,getter2,TransformerLinLin(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
                case ImPlotScale_LogLin: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLogLin>(getter1,getter2,TransformerLogLin(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
                case ImPlotScale_LinLog: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLinLog>(getter1,getter2,TransformerLinLog(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
                case ImPlotScale_LogLog: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLogLog>(getter1,getter2,TransformerLogLog(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
            }
        }
        EndItem();
    }
}